

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf2c.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  ostream *poVar4;
  size_type __n;
  char *pcVar5;
  long *plVar6;
  runtime_error *this;
  int *piVar7;
  reference pcVar8;
  undefined1 auVar9 [16];
  vector<char,_std::allocator<char>_> *local_688;
  ostream local_5b0 [8];
  ofstream cFile;
  allocator<char> local_3a9;
  string local_3a8 [32];
  vector<char,_std::allocator<char>_> *local_388;
  size_t indent;
  iterator iStack_378;
  char c;
  iterator __end1;
  iterator __begin1;
  vector<char,_std::allocator<char>_> *__range1;
  size_t tabs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  allocator_type local_309;
  undefined1 local_308 [8];
  vector<char,_std::allocator<char>_> bfContent;
  size_t size;
  pos_type end;
  char local_2c8 [8];
  ifstream bfFile;
  allocator<char> local_b9;
  string local_b8 [8];
  string code;
  string local_90;
  undefined4 local_70;
  allocator<char> local_69;
  string local_68;
  undefined1 local_38 [8];
  string bfFilename;
  char **argv_local;
  int argc_local;
  
  bfFilename.field_2._8_8_ = argv;
  std::__cxx11::string::string((string *)local_38);
  if (argc == 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Not enough arguments.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar5 = *(char **)bfFilename.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar5,&local_69);
    PrintUsage(&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    argv_local._4_4_ = 1;
    local_70 = 1;
  }
  else if (argc == 2) {
    std::__cxx11::string::operator=((string *)local_38,*(char **)(bfFilename.field_2._8_8_ + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_b8,
               "#include <stdio.h>\n#include <stdlib.h>\n\nint main() {\n\tchar* p = calloc(30000, sizeof(char));\n"
               ,&local_b9);
    std::allocator<char>::~allocator(&local_b9);
    _Var3 = std::operator|(_S_bin,_S_ate);
    std::ifstream::ifstream(local_2c8,(string *)local_38,_Var3);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Failed to open \'");
      poVar4 = std::operator<<(poVar4,(string *)local_38);
      poVar4 = std::operator<<(poVar4,"\'.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      local_70 = 1;
    }
    else {
      auVar9 = std::istream::tellg();
      _end = auVar9._8_8_;
      size = auVar9._0_8_;
      std::istream::seekg((long)local_2c8,_S_beg);
      bfContent.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
           std::istream::tellg();
      __n = std::fpos<__mbstate_t>::operator-
                      ((fpos<__mbstate_t> *)&size,
                       (fpos<__mbstate_t> *)
                       &bfContent.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                      );
      if (__n == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"The file \'");
        poVar4 = std::operator<<(poVar4,(string *)local_38);
        poVar4 = std::operator<<(poVar4,"\' was empty.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
        local_70 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_308,__n,&local_309);
        std::allocator<char>::~allocator(&local_309);
        pcVar5 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)local_308);
        std::vector<char,_std::allocator<char>_>::size
                  ((vector<char,_std::allocator<char>_> *)local_308);
        plVar6 = (long *)std::istream::read(local_2c8,(long)pcVar5);
        bVar1 = std::ios::operator!((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
        if ((bVar1 & 1) != 0) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_350,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38,": ");
          piVar7 = __errno_location();
          pcVar5 = strerror(*piVar7);
          std::operator+(&local_330,&local_350,pcVar5);
          std::runtime_error::runtime_error(this,(string *)&local_330);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::ifstream::close();
        __range1 = (vector<char,_std::allocator<char>_> *)0x1;
        __end1 = std::vector<char,_std::allocator<char>_>::begin
                           ((vector<char,_std::allocator<char>_> *)local_308);
        iStack_378 = std::vector<char,_std::allocator<char>_>::end
                               ((vector<char,_std::allocator<char>_> *)local_308);
        while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffc88), bVar2) {
          pcVar8 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&__end1);
          indent._7_1_ = *pcVar8;
          if (indent._7_1_ == ']') {
            local_688 = (vector<char,_std::allocator<char>_> *)
                        &__range1[-1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         field_0x17;
          }
          else {
            local_688 = __range1;
          }
          local_388 = local_688;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_3a8,(size_type)local_688,'\t',&local_3a9);
          std::__cxx11::string::operator+=(local_b8,local_3a8);
          std::__cxx11::string::~string(local_3a8);
          std::allocator<char>::~allocator(&local_3a9);
          switch(indent._7_1_) {
          case '+':
            std::__cxx11::string::operator+=(local_b8,"++*p;\n");
            break;
          case ',':
            std::__cxx11::string::operator+=(local_b8,"*p = getchar();\n");
            break;
          case '-':
            std::__cxx11::string::operator+=(local_b8,"--*p;\n");
            break;
          case '.':
            std::__cxx11::string::operator+=(local_b8,"putchar(*p);\n");
            break;
          default:
            break;
          case '<':
            std::__cxx11::string::operator+=(local_b8,"--p;\n");
            break;
          case '>':
            std::__cxx11::string::operator+=(local_b8,"++p;\n");
            break;
          case '[':
            std::__cxx11::string::operator+=(local_b8,"while (*p) {\n");
            __range1 = (vector<char,_std::allocator<char>_> *)
                       &(__range1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        field_0x1;
            break;
          case ']':
            std::__cxx11::string::operator+=(local_b8,"}\n");
            __range1 = (vector<char,_std::allocator<char>_> *)
                       &__range1[-1].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        field_0x17;
          }
          __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
          operator++(&__end1);
        }
        std::__cxx11::string::operator+=(local_b8,"\tfree(p);\n}");
        std::ofstream::ofstream(local_5b0,"output.c",_S_out);
        poVar4 = std::operator<<(local_5b0,local_b8);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 0;
        local_70 = 1;
        std::ofstream::~ofstream(local_5b0);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_308);
      }
    }
    std::ifstream::~ifstream(local_2c8);
    std::__cxx11::string::~string(local_b8);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Too much arguments.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar5 = *(char **)bfFilename.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,pcVar5,(allocator<char> *)(code.field_2._M_local_buf + 0xf));
    PrintUsage(&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)(code.field_2._M_local_buf + 0xf));
    argv_local._4_4_ = 1;
    local_70 = 1;
  }
  std::__cxx11::string::~string((string *)local_38);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    std::string bfFilename;
    
    if (argc == 1) {
        std::cout << "Not enough arguments." << std::endl;
        PrintUsage(argv[0]);
        return EXIT_FAILURE;
    }
    if (argc == 2) {
        bfFilename = argv[1];
    } else {
        std::cout << "Too much arguments." << std::endl;
        PrintUsage(argv[0]);
        return EXIT_FAILURE;
    }

    std::string code = 
        "#include <stdio.h>" "\n" 
        "#include <stdlib.h>" "\n"
        "\n"
        "int main() {" "\n"
        "\t" "char* p = calloc(30000, sizeof(char));" "\n";
    
    std::ifstream bfFile { bfFilename, std::ios::binary|std::ios::ate };
    
    if (!bfFile.is_open()) {
        std::cout << "Failed to open '" << bfFilename << "'." << std::endl;
        return EXIT_FAILURE;
    }

    auto end = bfFile.tellg();
    bfFile.seekg(0, std::ios::beg);
    auto size = std::size_t(end - bfFile.tellg());

    if (size == 0) {
        std::cout << "The file '" << bfFilename << "' was empty." << std::endl;
        return EXIT_FAILURE;
    }

    std::vector<char> bfContent(size);
    if (!bfFile.read(bfContent.data(), bfContent.size())) {
        throw std::runtime_error(bfFilename + ": " + std::strerror(errno));
    }
    bfFile.close();

    std::size_t tabs = 1;
    for (const char c : bfContent) {
        const std::size_t indent = (c != ']') ? tabs : tabs - 1;
        code += std::string(indent, '\t');
        switch (c) {
            case '>': 
                code += "++p;" "\n";
                break;
            case '<':
                code += "--p;" "\n";
                break;
            case '+':
                code += "++*p;" "\n";
                break;
            case '-':
                code += "--*p;" "\n";
                break;
            case '.':
                code += "putchar(*p);" "\n";
                break;
            case ',':
                code += "*p = getchar();" "\n";
                break;
            case '[':
                code += "while (*p) {" "\n";
                ++tabs;
                break;
            case ']':
                code += "}" "\n";
                --tabs;
                break;
            default: break;
        }
    }

    code += "\t" "free(p);" "\n" "}";

    std::ofstream cFile { "output.c" };
    cFile << code << std::endl;

    return EXIT_SUCCESS;
}